

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O1

void __thiscall
BVSparse<Memory::JitArenaAllocator>::And
          (BVSparse<Memory::JitArenaAllocator> *this,BVSparse<Memory::JitArenaAllocator> *bv1,
          BVSparse<Memory::JitArenaAllocator> *bv2)

{
  Type pJVar1;
  Type pBVar2;
  Type_conflict pBVar3;
  Type_conflict pBVar4;
  
  if (this->head != (Type_conflict)0x0) {
    pJVar1 = this->alloc;
    pBVar2 = this->head;
    pBVar4 = pJVar1->bvFreeList;
    do {
      pBVar3 = pBVar2;
      pBVar2 = pBVar3->next;
      pBVar3->next = pBVar4;
      pBVar4 = pBVar3;
    } while (pBVar2 != (Type)0x0);
    pJVar1->bvFreeList = pBVar3;
  }
  this->head = (Type_conflict)0x0;
  this->lastFoundIndex = (Type_conflict)0x0;
  this->lastUsedNodePrevNextField = &this->head;
  for_each<&BVUnitT<unsigned_long>::And>(this,bv1,bv2);
  return;
}

Assistant:

void
BVSparse<TAllocator>::ClearAll()
{
    BVSparseNode* nextNode;
    for(BVSparseNode * node = this->head; node != 0 ; node = nextNode)
    {
        nextNode = node->next;
        QueueInFreeList(node);
    }
    this->head = nullptr;
    this->lastFoundIndex = nullptr;
    this->lastUsedNodePrevNextField = &this->head;
}